

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_nonfinite<char,fmt::v10::appender>
                   (appender out,bool isnan,format_specs<char> specs,float_specs *fspecs)

{
  size_t sVar1;
  char *pcVar2;
  appender aVar3;
  byte in_SIL;
  long in_R8;
  bool is_zero_fill;
  size_t size;
  sign_t sign;
  size_t str_size;
  char *str;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar4;
  char *in_stack_ffffffffffffff78;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_ffffffffffffff88;
  char *specs_00;
  fill_t<char> afStack_15 [4];
  
  if ((in_SIL & 1) == 0) {
    if ((*(uint *)(in_R8 + 4) >> 0x10 & 1) == 0) {
      in_stack_ffffffffffffff78 = "inf";
      specs_00 = in_stack_ffffffffffffff78;
    }
    else {
      in_stack_ffffffffffffff78 = "INF";
      specs_00 = in_stack_ffffffffffffff78;
    }
  }
  else if ((*(uint *)(in_R8 + 4) >> 0x10 & 1) == 0) {
    specs_00 = "nan";
    in_stack_ffffffffffffff88.container = (buffer<char> *)specs_00;
  }
  else {
    specs_00 = "NAN";
    in_stack_ffffffffffffff88.container = (buffer<char> *)specs_00;
  }
  sVar1 = fill_t<char>::size(afStack_15);
  uVar4 = false;
  if (sVar1 == 1) {
    pcVar2 = fill_t<char>::data(afStack_15);
    uVar4 = *pcVar2 == '0';
  }
  if ((bool)uVar4 != false) {
    pcVar2 = fill_t<char>::operator[](afStack_15,0);
    *pcVar2 = ' ';
  }
  aVar3 = write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write_nonfinite<char,fmt::v10::appender>(fmt::v10::appender,bool,fmt::v10::format_specs<char>,fmt::v10::detail::float_specs_const&)::_lambda(fmt::v10::appender)_1_>
                    ((appender)in_stack_ffffffffffffff88.container,(format_specs<char> *)specs_00,
                     (size_t)in_stack_ffffffffffffff78,
                     (anon_class_16_2_632e021f *)CONCAT17(uVar4,in_stack_ffffffffffffff70));
  return (appender)
         aVar3.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_nonfinite(OutputIt out, bool isnan,
                                     format_specs<Char> specs,
                                     const float_specs& fspecs) -> OutputIt {
  auto str =
      isnan ? (fspecs.upper ? "NAN" : "nan") : (fspecs.upper ? "INF" : "inf");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  // Replace '0'-padding with space for non-finite values.
  const bool is_zero_fill =
      specs.fill.size() == 1 && *specs.fill.data() == static_cast<Char>('0');
  if (is_zero_fill) specs.fill[0] = static_cast<Char>(' ');
  return write_padded(out, specs, size, [=](reserve_iterator<OutputIt> it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    return copy_str<Char>(str, str + str_size, it);
  });
}